

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_Ntk4DumpWeightsInt(Acb_Ntk_t *pNtk,Vec_Int_t *vObjs,char *pFileName)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Acb_ObjType_t AVar5;
  FILE *__stream;
  Vec_Int_t *vStart;
  Vec_Int_t *vRes;
  Vec_Int_t *vDists;
  char *pcVar6;
  ulong uVar7;
  int i;
  int iVar8;
  Vec_Int_t t;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Canont open input file \"%s\".\n",pFileName);
    return;
  }
  vStart = Vec_IntAlloc(100);
  vRes = Vec_IntAlloc(100);
  vDists = Vec_IntStart((pNtk->vObjType).nSize);
  Acb_NtkIncTravId(pNtk);
  i = 1;
  for (iVar8 = 0; iVar8 < vObjs->nSize; iVar8 = iVar8 + 1) {
    iVar4 = Vec_IntEntry(vObjs,iVar8);
    Acb_ObjSetTravIdCur(pNtk,iVar4);
    Vec_IntWriteEntry(vDists,iVar4,1);
    Vec_IntPush(vStart,iVar4);
  }
  while (Acb_Ntk4CollectRing(pNtk,vStart,vRes,vDists), vRes->nSize != 0) {
    vStart->nSize = 0;
    iVar4 = vStart->nCap;
    iVar3 = vStart->nSize;
    piVar1 = vStart->pArray;
    iVar8 = vRes->nSize;
    piVar2 = vRes->pArray;
    vStart->nCap = vRes->nCap;
    vStart->nSize = iVar8;
    vStart->pArray = piVar2;
    vRes->nCap = iVar4;
    vRes->nSize = iVar3;
    vRes->pArray = piVar1;
  }
  Vec_IntFree(vStart);
  Vec_IntFree(vRes);
  for (; i < (pNtk->vObjType).nSize; i = i + 1) {
    AVar5 = Acb_ObjType(pNtk,i);
    if (AVar5 != ABC_OPER_NONE) {
      pcVar6 = Acb_ObjNameStr(pNtk,i);
      iVar8 = Vec_IntEntry(vDists,i);
      uVar7 = (ulong)(iVar8 + 100000);
      if (iVar8 == 0) {
        uVar7 = 110000;
      }
      fprintf(__stream,"%s %d\n",pcVar6,uVar7);
    }
  }
  Vec_IntFree(vDists);
  fclose(__stream);
  return;
}

Assistant:

void Acb_Ntk4DumpWeightsInt( Acb_Ntk_t * pNtk, Vec_Int_t * vObjs, char * pFileName )
{
    int i, iObj;//, Weight;
    Vec_Int_t * vDists, * vStart, * vNexts;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Canont open input file \"%s\".\n", pFileName );
        return;
    }
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Acb_NtkObjNumMax(pNtk) );
    Acb_NtkIncTravId( pNtk );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Acb_ObjSetTravIdCur(pNtk, iObj);
        Vec_IntWriteEntry( vDists, iObj, 1 );
        Vec_IntPush( vStart, iObj );
    }    
    while ( 1 )
    {
        Acb_Ntk4CollectRing( pNtk, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    // create weights
//    Vec_IntForEachEntry( vDists, Weight, i )
//        if ( Weight && Acb_ObjNameStr(pNtk, i)[0] != '1' )
//            fprintf( pFile, "%s %d\n", Acb_ObjNameStr(pNtk, i), 10000+Weight );
    Acb_NtkForEachObj( pNtk, iObj )
    {
        char * pName = Acb_ObjNameStr(pNtk, iObj);
        int Weight = Vec_IntEntry(vDists, iObj);
        if ( Weight == 0 )
            Weight = 10000;
        fprintf( pFile, "%s %d\n", pName, 100000+Weight );
    }

    Vec_IntFree( vDists );
    fclose( pFile );
}